

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall Palette::addColor(Palette *this,uint16_t color)

{
  size_type sVar1;
  reference pvVar2;
  ulong local_20;
  size_t i;
  uint16_t color_local;
  Palette *this_local;
  
  local_20 = 0;
  while( true ) {
    sVar1 = std::array<unsigned_short,_4UL>::size(&this->colors);
    if (sVar1 <= local_20) {
      __assert_fail("i < colors.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/main.cpp"
                    ,0x31e,"addColor");
    }
    pvVar2 = std::array<unsigned_short,_4UL>::operator[](&this->colors,local_20);
    if (*pvVar2 == color) break;
    pvVar2 = std::array<unsigned_short,_4UL>::operator[](&this->colors,local_20);
    if (*pvVar2 == 0xffff) {
      pvVar2 = std::array<unsigned_short,_4UL>::operator[](&this->colors,local_20);
      *pvVar2 = color;
      return;
    }
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void Palette::addColor(uint16_t color) {
	for (size_t i = 0; true; ++i) {
		assert(i < colors.size()); // The packing should guarantee this
		if (colors[i] == color) { // The color is already present
			break;
		} else if (colors[i] == UINT16_MAX) { // Empty slot
			colors[i] = color;
			break;
		}
	}
}